

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.h
# Opt level: O3

string * __thiscall
Component::mount_type_str_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = *(int *)&(this->super_BoardElement).field_0xc;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 2) {
    pcVar3 = "DIP";
    pcVar2 = "";
  }
  else if (iVar1 == 1) {
    pcVar3 = "SMD";
    pcVar2 = "";
  }
  else {
    pcVar3 = "UNKNOWN";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string mount_type_str() {
		switch (mount_type) {
			case Component::kMountTypeSMD: return "SMD";
			case Component::kMountTypeDIP: return "DIP";
			default: return "UNKNOWN";
		}
	}